

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

bool draco::parser::PeekWhitespace(DecoderBuffer *buffer,bool *end_reached)

{
  bool bVar1;
  int iVar2;
  undefined1 *in_RSI;
  DecoderBuffer *in_RDI;
  uint8_t c;
  byte local_19;
  undefined1 *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = DecoderBuffer::Peek<unsigned_char>(in_RDI,&local_19);
  if (bVar1) {
    iVar2 = isspace((uint)local_19);
    if (iVar2 == 0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    *local_18 = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PeekWhitespace(DecoderBuffer *buffer, bool *end_reached) {
  uint8_t c;
  if (!buffer->Peek(&c)) {
    *end_reached = true;
    return false;  // eof reached.
  }
  if (!isspace(c)) {
    return false;  // Non-whitespace character reached.
  }
  return true;
}